

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O3

BoolExpr * BO_not(List *ls)

{
  BoolExpr *pBVar1;
  BoolExpr *pBVar2;
  
  pBVar1 = make_boolean_expr(ls->cdr);
  if (pBVar1 == (BoolExpr *)0x0) {
    parse_error(ls,"not takes an argument!\n");
  }
  else {
    if (pBVar1->type == E_FALSE) {
      return &true_bool_expr;
    }
    if (pBVar1->type != E_TRUE) {
      pBVar2 = (BoolExpr *)malloc(0x18);
      pBVar2->type = E_NOT;
      pBVar2->subexpr = pBVar1;
      pBVar2->next = (BoolExprStruct *)0x0;
      return pBVar2;
    }
  }
  return &false_bool_expr;
}

Assistant:

static BoolExpr *
BO_not (const List *ls)
{
  BoolExpr *subexpr = make_boolean_expr (ls->cdr);

  if (subexpr == NULL)
    {
      parse_error(ls, "not takes an argument!\n");
      return &false_bool_expr;  /* default = FALSE */
    }
  if (subexpr->type == E_FALSE) return &true_bool_expr;
  if (subexpr->type == E_TRUE ) return &false_bool_expr;
  return create_bool_expr (E_NOT, subexpr);
}